

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt_pal.cpp
# Opt level: O1

void __thiscall
swrenderer::DrawColumnRt1PalCommand::Execute(DrawColumnRt1PalCommand *this,DrawerThread *thread)

{
  int iVar1;
  uint8_t *puVar2;
  ulong uVar3;
  int iVar4;
  byte *pbVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  uint8_t *puVar10;
  int iVar11;
  
  iVar1 = (this->super_PalRtCommand).yl;
  iVar4 = ((this->super_PalRtCommand).yh - iVar1) + 1;
  iVar11 = thread->pass_end_y - iVar1;
  if (iVar11 < 1) {
    iVar11 = 0;
  }
  if (iVar4 < iVar11) {
    iVar11 = iVar4;
  }
  uVar6 = thread->pass_start_y - iVar1;
  if ((int)uVar6 < 1) {
    uVar6 = 0;
  }
  iVar4 = thread->num_cores;
  iVar7 = (iVar4 - (int)((iVar1 + uVar6) - thread->core) % iVar4) % iVar4;
  uVar3 = (long)(int)((~uVar6 + iVar4 + iVar11) - iVar7) / (long)iVar4;
  if (0 < (int)uVar3) {
    puVar2 = (this->super_PalRtCommand)._colormap;
    iVar7 = iVar1 + uVar6 + iVar7;
    puVar10 = (this->super_PalRtCommand)._destorg +
              (long)(this->super_PalRtCommand).sx + (long)(int)(&ylookup)[iVar7];
    pbVar5 = thread->dc_temp +
             (long)*(int *)&(this->super_PalRtCommand).super_DrawerCommand.field_0xc +
             (long)(iVar7 / iVar4) * 4;
    lVar8 = (long)(this->super_PalRtCommand)._pitch * (long)iVar4;
    if ((uVar3 & 1) != 0) {
      *puVar10 = puVar2[*pbVar5];
      pbVar5 = pbVar5 + 4;
      puVar10 = puVar10 + lVar8;
    }
    if ((int)uVar3 != 1) {
      lVar9 = 0;
      do {
        *puVar10 = puVar2[pbVar5[lVar9 * 8]];
        puVar10[lVar8] = puVar2[pbVar5[lVar9 * 8 + 4]];
        puVar10 = puVar10 + (int)lVar8 * 2;
        lVar9 = lVar9 + 1;
      } while ((int)((uVar3 & 0xffffffff) >> 1) != (int)lVar9);
    }
  }
  return;
}

Assistant:

void DrawColumnRt1PalCommand::Execute(DrawerThread *thread)
	{
		const uint8_t *colormap;
		uint8_t *source;
		uint8_t *dest;
		int count;
		int pitch;

		count = yh - yl + 1;

		count = thread->count_for_thread(yl, count);
		if (count <= 0)
			return;

		colormap = _colormap;
		dest = ylookup[yl + thread->skipped_by_thread(yl)] + sx + _destorg;
		source = &thread->dc_temp[thread->temp_line_for_thread(yl) *4 + hx];
		pitch = _pitch*thread->num_cores;

		if (count & 1) {
			*dest = colormap[*source];
			source += 4;
			dest += pitch;
		}
		if (!(count >>= 1))
			return;

		do {
			dest[0] = colormap[source[0]];
			dest[pitch] = colormap[source[4]];
			source += 8;
			dest += pitch*2;
		} while (--count);
	}